

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void start_scope(LinearizerState *linearizer,Proc *proc,Scope *scope)

{
  uint uVar1;
  Pseudo *local_50;
  Pseudo *pseudo;
  undefined1 local_40 [7];
  uint8_t reg;
  PtrListIterator symiter__;
  LuaSymbol *sym;
  Scope *scope_local;
  Proc *proc_local;
  LinearizerState *linearizer_local;
  
  proc->current_scope = scope;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_40,(PtrList *)scope->symbol_list);
  symiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_40);
  while (symiter__._16_8_ != 0) {
    if (*(int *)symiter__._16_8_ == 0) {
      if ((((*(byte *)(symiter__._16_8_ + 0x30) & 1) == 0) &&
          ((*(byte *)(symiter__._16_8_ + 0x30) >> 1 & 1) == 0)) &&
         ((*(int *)(symiter__._16_8_ + 8) == 0x10 || (*(int *)(symiter__._16_8_ + 8) == 8)))) {
        if (*(int *)(symiter__._16_8_ + 8) == 0x10) {
          local_50 = allocate_temp_pseudo(proc,RAVI_TNUMFLT,true);
        }
        else {
          local_50 = allocate_temp_pseudo(proc,RAVI_TNUMINT,true);
        }
        *(Pseudo **)(symiter__._16_8_ + 0x38) = local_50;
        (local_50->field_3).symbol = (LuaSymbol *)symiter__._16_8_;
      }
      else {
        uVar1 = allocate_register(&proc->local_pseudos,true);
        allocate_symbol_pseudo(proc,(LuaSymbol *)symiter__._16_8_,uVar1 & 0xff);
      }
    }
    symiter__._16_8_ = raviX_ptrlist_iter_next((PtrListIterator *)local_40);
  }
  return;
}

Assistant:

static void start_scope(LinearizerState *linearizer, Proc *proc, Scope *scope)
{
	proc->current_scope = scope;
	LuaSymbol *sym;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			uint8_t reg;
			if (!sym->variable.escaped && !sym->variable.function_parameter &&
			    (sym->variable.value_type.type_code == RAVI_TNUMFLT ||
			     sym->variable.value_type.type_code == RAVI_TNUMINT)) {
				Pseudo *pseudo;
				if (sym->variable.value_type.type_code == RAVI_TNUMFLT)
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMFLT, true);
				else
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMINT, true);
				sym->variable.pseudo = pseudo;
				pseudo->temp_for_local = sym; /* Note that this temp is for a local */
			}
			else {
				reg = allocate_register(&proc->local_pseudos, true);
				allocate_symbol_pseudo(proc, sym, reg);
			}
		}
	}
	END_FOR_EACH_PTR(sym)
}